

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

BuiltIn __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::TranslateBuiltInDecoration
          (TGlslangToSpvTraverser *this,TBuiltInVariable builtIn,bool memberDeclaration)

{
  EShLanguage EVar1;
  BuiltIn BVar2;
  Capability CVar3;
  char *pcVar4;
  
  switch(builtIn) {
  case EbvNumWorkGroups:
    BVar2 = BuiltInNumWorkgroups;
    break;
  case EbvWorkGroupSize:
    BVar2 = BuiltInWorkgroupSize;
    break;
  case EbvWorkGroupId:
    BVar2 = BuiltInWorkgroupId;
    break;
  case EbvLocalInvocationId:
    BVar2 = BuiltInLocalInvocationId;
    break;
  case EbvGlobalInvocationId:
    BVar2 = BuiltInGlobalInvocationId;
    break;
  case EbvLocalInvocationIndex:
    BVar2 = BuiltInLocalInvocationIndex;
    break;
  case EbvNumSubgroups:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    BVar2 = BuiltInNumSubgroups;
    break;
  case EbvSubgroupID:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    BVar2 = BuiltInSubgroupId;
    break;
  case EbvSubGroupSize:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    CVar3 = CapabilitySubgroupBallotKHR;
    goto LAB_003bbda8;
  case EbvSubGroupInvocation:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    CVar3 = CapabilitySubgroupBallotKHR;
    goto LAB_003bbf56;
  case EbvSubGroupEqMask:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    CVar3 = CapabilitySubgroupBallotKHR;
    goto LAB_003bbece;
  case EbvSubGroupGeMask:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    CVar3 = CapabilitySubgroupBallotKHR;
    goto LAB_003bc142;
  case EbvSubGroupGtMask:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    CVar3 = CapabilitySubgroupBallotKHR;
    goto LAB_003bc0a8;
  case EbvSubGroupLeMask:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    CVar3 = CapabilitySubgroupBallotKHR;
    goto LAB_003bc061;
  case EbvSubGroupLtMask:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    CVar3 = CapabilitySubgroupBallotKHR;
    goto LAB_003bbd8f;
  case EbvSubgroupSize2:
    CVar3 = CapabilityGroupNonUniform;
LAB_003bbda8:
    spv::Builder::addCapability(&this->builder,CVar3);
    BVar2 = BuiltInSubgroupSize;
    break;
  case EbvSubgroupInvocation2:
    CVar3 = CapabilityGroupNonUniform;
LAB_003bbf56:
    spv::Builder::addCapability(&this->builder,CVar3);
    BVar2 = BuiltInSubgroupLocalInvocationId;
    break;
  case EbvSubgroupEqMask2:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    CVar3 = CapabilityGroupNonUniformBallot;
LAB_003bbece:
    spv::Builder::addCapability(&this->builder,CVar3);
    BVar2 = BuiltInSubgroupEqMask;
    break;
  case EbvSubgroupGeMask2:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    CVar3 = CapabilityGroupNonUniformBallot;
LAB_003bc142:
    spv::Builder::addCapability(&this->builder,CVar3);
    BVar2 = BuiltInSubgroupGeMask;
    break;
  case EbvSubgroupGtMask2:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    CVar3 = CapabilityGroupNonUniformBallot;
LAB_003bc0a8:
    spv::Builder::addCapability(&this->builder,CVar3);
    BVar2 = BuiltInSubgroupGtMask;
    break;
  case EbvSubgroupLeMask2:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    CVar3 = CapabilityGroupNonUniformBallot;
LAB_003bc061:
    spv::Builder::addCapability(&this->builder,CVar3);
    BVar2 = BuiltInSubgroupLeMask;
    break;
  case EbvSubgroupLtMask2:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    CVar3 = CapabilityGroupNonUniformBallot;
LAB_003bbd8f:
    spv::Builder::addCapability(&this->builder,CVar3);
    BVar2 = BuiltInSubgroupLtMask;
    break;
  case EbvVertexId:
    BVar2 = BuiltInVertexId;
    break;
  case EbvInstanceId:
    BVar2 = BuiltInInstanceId;
    break;
  case EbvVertexIndex:
    BVar2 = BuiltInVertexIndex;
    break;
  case EbvInstanceIndex:
    BVar2 = BuiltInInstanceIndex;
    break;
  case EbvBaseVertex:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_shader_draw_parameters",Spv_1_3);
    spv::Builder::addCapability(&this->builder,CapabilityDrawParameters);
    BVar2 = BaseVertex;
    break;
  case EbvBaseInstance:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_shader_draw_parameters",Spv_1_3);
    spv::Builder::addCapability(&this->builder,CapabilityDrawParameters);
    BVar2 = BaseInstance;
    break;
  case EbvDrawId:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_shader_draw_parameters",Spv_1_3);
    spv::Builder::addCapability(&this->builder,CapabilityDrawParameters);
    BVar2 = BuiltInDrawIndex;
    break;
  case EbvPosition:
    BVar2 = BuiltInPosition;
    break;
  case EbvPointSize:
    BVar2 = BuiltInPointSize;
    if (memberDeclaration) {
      return BuiltInPointSize;
    }
    EVar1 = this->glslangIntermediate->language;
    if (EVar1 - EShLangTessControl < 2) {
      CVar3 = CapabilityTessellationPointSize;
    }
    else {
      if (EVar1 != EShLangGeometry) {
        return BuiltInPointSize;
      }
      CVar3 = CapabilityGeometryPointSize;
    }
    goto LAB_003bc535;
  default:
    BVar2 = BuiltInMax;
    break;
  case EbvClipDistance:
    BVar2 = BuiltInClipDistance;
    if (memberDeclaration) {
      return BuiltInClipDistance;
    }
    CVar3 = CapabilityClipDistance;
    goto LAB_003bc535;
  case EbvCullDistance:
    BVar2 = BuiltInCullDistance;
    if (memberDeclaration) {
      return BuiltInCullDistance;
    }
    CVar3 = CapabilityCullDistance;
    goto LAB_003bc535;
  case EbvInvocationId:
    BVar2 = BuiltInInvocationId;
    break;
  case EbvPrimitiveId:
    BVar2 = BuiltInPrimitiveId;
    if (this->glslangIntermediate->language != EShLangFragment) {
      return BuiltInPrimitiveId;
    }
    CVar3 = CapabilityGeometry;
    goto LAB_003bc535;
  case EbvLayer:
    EVar1 = this->glslangIntermediate->language;
    BVar2 = BuiltInLayer;
    if (EVar1 - EShLangGeometry < 2) {
      spv::Builder::addCapability(&this->builder,CapabilityGeometry);
      EVar1 = this->glslangIntermediate->language;
    }
    else if (EVar1 == EShLangMesh) {
      return BuiltInLayer;
    }
    if (EShLangTessEvaluation < EVar1) {
      return BuiltInLayer;
    }
    if ((this->builder).spvVersion < 0x10500) {
LAB_003bc504:
      spv::Builder::addIncorporatedExtension
                (&this->builder,"SPV_EXT_shader_viewport_index_layer",Spv_1_5);
      CVar3 = CapabilityShaderViewportIndexLayerEXT;
    }
    else {
      CVar3 = CapabilityShaderLayer;
    }
    goto LAB_003bc535;
  case EbvViewportIndex:
    EVar1 = this->glslangIntermediate->language;
    if (EVar1 - EShLangGeometry < 2) {
      spv::Builder::addCapability(&this->builder,CapabilityMultiViewport);
      EVar1 = this->glslangIntermediate->language;
    }
    BVar2 = BuiltInViewportIndex;
    if (EShLangTessEvaluation < EVar1) {
      return BuiltInViewportIndex;
    }
    if ((this->builder).spvVersion < 0x10500) goto LAB_003bc504;
    CVar3 = CapabilityShaderViewportIndex;
    goto LAB_003bc535;
  case EbvPatchVertices:
    BVar2 = BuiltInPatchVertices;
    break;
  case EbvTessLevelOuter:
    BVar2 = BuiltInTessLevelOuter;
    break;
  case EbvTessLevelInner:
    BVar2 = BuiltInTessLevelInner;
    break;
  case EbvTessCoord:
    BVar2 = BuiltInTessCoord;
    break;
  case EbvFace:
    BVar2 = BuiltInFrontFacing;
    break;
  case EbvFragCoord:
    BVar2 = BuiltInFragCoord;
    break;
  case EbvPointCoord:
    BVar2 = BuiltInPointCoord;
    break;
  case EbvFragDepth:
    BVar2 = BuiltInFragDepth;
    break;
  case EbvFragStencilRef:
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_stencil_export");
    spv::Builder::addCapability(&this->builder,CapabilityStencilExportEXT);
    BVar2 = BuiltInFragStencilRefEXT;
    break;
  case EbvSampleId:
    spv::Builder::addCapability(&this->builder,CapabilitySampleRateShading);
    BVar2 = BuiltInSampleId;
    break;
  case EbvSamplePosition:
    spv::Builder::addCapability(&this->builder,CapabilitySampleRateShading);
    BVar2 = BuiltInSamplePosition;
    break;
  case EbvSampleMask:
    BVar2 = BuiltInSampleMask;
    break;
  case EbvHelperInvocation:
    BVar2 = BuiltInHelperInvocation;
    break;
  case EbvBaryCoordNoPersp:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    BVar2 = BaryCoordNoPerspAMD;
    break;
  case EbvBaryCoordNoPerspCentroid:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    BVar2 = BaryCoordNoPerspCentroidAMD;
    break;
  case EbvBaryCoordNoPerspSample:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    BVar2 = BaryCoordNoPerspSampleAMD;
    break;
  case EbvBaryCoordSmooth:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    BVar2 = BaryCoordSmoothAMD;
    break;
  case EbvBaryCoordSmoothCentroid:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    BVar2 = BaryCoordSmoothCentroidAMD;
    break;
  case EbvBaryCoordSmoothSample:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    BVar2 = BaryCoordSmoothSampleAMD;
    break;
  case EbvBaryCoordPullModel:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    BVar2 = BaryCoordPullModelAMD;
    break;
  case EbvViewIndex:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_multiview",Spv_1_3);
    spv::Builder::addCapability(&this->builder,CapabilityMultiView);
    BVar2 = BuiltInViewIndex;
    break;
  case EbvDeviceIndex:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_device_group",Spv_1_3);
    spv::Builder::addCapability(&this->builder,CapabilityDeviceGroup);
    BVar2 = BuiltInDeviceIndex;
    break;
  case EbvShadingRateKHR:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_fragment_shading_rate");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentShadingRateKHR);
    BVar2 = BuiltInShadingRateKHR;
    break;
  case EbvPrimitiveShadingRateKHR:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_fragment_shading_rate");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentShadingRateKHR);
    BVar2 = BuiltInPrimitiveShadingRateKHR;
    break;
  case EbvFragSizeEXT:
    pcVar4 = "SPV_EXT_fragment_invocation_density";
    goto LAB_003bc35d;
  case EbvFragInvocationCountEXT:
    pcVar4 = "SPV_EXT_fragment_invocation_density";
    goto LAB_003bc3ab;
  case EbvViewportMaskNV:
    BVar2 = BuiltInViewportMaskNV;
    if (memberDeclaration) {
      return BuiltInViewportMaskNV;
    }
    spv::Builder::addExtension(&this->builder,"SPV_NV_viewport_array2");
    CVar3 = CapabilityShaderViewportMaskNV;
    goto LAB_003bc535;
  case EbvSecondaryPositionNV:
    BVar2 = BuiltInSecondaryPositionNV;
    goto LAB_003bc1e3;
  case EbvSecondaryViewportMaskNV:
    BVar2 = BuiltInSecondaryViewportMaskNV;
LAB_003bc1e3:
    if (memberDeclaration) {
      return BVar2;
    }
    spv::Builder::addExtension(&this->builder,"SPV_NV_stereo_view_rendering");
    CVar3 = CapabilityShaderStereoViewNV;
    goto LAB_003bc535;
  case EbvPositionPerViewNV:
    BVar2 = BuiltInPositionPerViewNV;
    goto LAB_003bc2b5;
  case EbvViewportMaskPerViewNV:
    BVar2 = BuiltInViewportMaskPerViewNV;
LAB_003bc2b5:
    if (memberDeclaration) {
      return BVar2;
    }
    spv::Builder::addExtension(&this->builder,"SPV_NVX_multiview_per_view_attributes");
    CVar3 = CapabilityPerViewAttributesNV;
LAB_003bc535:
    spv::Builder::addCapability(&this->builder,CVar3);
    break;
  case EbvFragFullyCoveredNV:
    spv::Builder::addExtension(&this->builder,"SPV_EXT_fragment_fully_covered");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentFullyCoveredEXT);
    BVar2 = BuiltInFullyCoveredEXT;
    break;
  case EbvFragmentSizeNV:
    pcVar4 = "SPV_NV_shading_rate";
LAB_003bc35d:
    spv::Builder::addExtension(&this->builder,pcVar4);
    spv::Builder::addCapability(&this->builder,CapabilityFragmentDensityEXT);
    BVar2 = BuiltInFragSizeEXT;
    break;
  case EbvInvocationsPerPixelNV:
    pcVar4 = "SPV_NV_shading_rate";
LAB_003bc3ab:
    spv::Builder::addExtension(&this->builder,pcVar4);
    spv::Builder::addCapability(&this->builder,CapabilityFragmentDensityEXT);
    BVar2 = BuiltInFragInvocationCountEXT;
    break;
  case EbvLaunchId:
    BVar2 = BuiltInLaunchIdKHR;
    break;
  case EbvLaunchSize:
    BVar2 = BuiltInLaunchSizeKHR;
    break;
  case EbvInstanceCustomIndex:
    BVar2 = BuiltInInstanceCustomIndexKHR;
    break;
  case EbvGeometryIndex:
    BVar2 = BuiltInRayGeometryIndexKHR;
    break;
  case EbvWorldRayOrigin:
    BVar2 = BuiltInWorldRayOriginKHR;
    break;
  case EbvWorldRayDirection:
    BVar2 = BuiltInWorldRayDirectionKHR;
    break;
  case EbvObjectRayOrigin:
    BVar2 = BuiltInObjectRayOriginKHR;
    break;
  case EbvObjectRayDirection:
    BVar2 = BuiltInObjectRayDirectionKHR;
    break;
  case EbvRayTmin:
    BVar2 = BuiltInRayTminKHR;
    break;
  case EbvRayTmax:
    BVar2 = BuiltInRayTmaxKHR;
    break;
  case EbvCullMask:
    BVar2 = BuiltInCullMaskKHR;
    break;
  case EbvHitKind:
    BVar2 = BuiltInHitKindKHR;
    break;
  case EbvObjectToWorld:
  case EbvObjectToWorld3x4:
    BVar2 = BuiltInObjectToWorldKHR;
    break;
  case EbvWorldToObject:
  case EbvWorldToObject3x4:
    BVar2 = BuiltInWorldToObjectKHR;
    break;
  case EbvIncomingRayFlags:
    BVar2 = BuiltInIncomingRayFlagsKHR;
    break;
  case EbvCurrentRayTimeNV:
    spv::Builder::addExtension(&this->builder,"SPV_NV_ray_tracing_motion_blur");
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingMotionBlurNV);
    BVar2 = BuiltInCurrentRayTimeNV;
    break;
  case EbvClusterIDNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingClusterAccelerationStructureNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_cluster_acceleration_structure");
    BVar2 = BuiltInClusterIDNV;
    break;
  case EbvBaryCoordNV:
    pcVar4 = "SPV_NV_fragment_shader_barycentric";
    goto LAB_003bb9ff;
  case EbvBaryCoordNoPerspNV:
    pcVar4 = "SPV_NV_fragment_shader_barycentric";
    goto LAB_003bc451;
  case EbvBaryCoordEXT:
    pcVar4 = "SPV_KHR_fragment_shader_barycentric";
LAB_003bb9ff:
    spv::Builder::addExtension(&this->builder,pcVar4);
    spv::Builder::addCapability(&this->builder,CapabilityFragmentBarycentricKHR);
    BVar2 = BaryCoordKHR;
    break;
  case EbvBaryCoordNoPerspEXT:
    pcVar4 = "SPV_KHR_fragment_shader_barycentric";
LAB_003bc451:
    spv::Builder::addExtension(&this->builder,pcVar4);
    spv::Builder::addCapability(&this->builder,CapabilityFragmentBarycentricKHR);
    BVar2 = BaryCoordNoPerspKHR;
    break;
  case EbvTaskCountNV:
    BVar2 = BuiltInTaskCountNV;
    break;
  case EbvPrimitiveCountNV:
    BVar2 = BuiltInPrimitiveCountNV;
    break;
  case EbvPrimitiveIndicesNV:
    BVar2 = BuiltInPrimitiveIndicesNV;
    break;
  case EbvClipDistancePerViewNV:
    BVar2 = BuiltInClipDistancePerViewNV;
    break;
  case EbvCullDistancePerViewNV:
    BVar2 = BuiltInCullDistancePerViewNV;
    break;
  case EbvLayerPerViewNV:
    BVar2 = BuiltInLayerPerViewNV;
    break;
  case EbvMeshViewCountNV:
    BVar2 = BuiltInMeshViewCountNV;
    break;
  case EbvMeshViewIndicesNV:
    BVar2 = BuiltInMeshViewIndicesNV;
    break;
  case EbvMicroTrianglePositionNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingDisplacementMicromapNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_displacement_micromap");
    BVar2 = BuiltInHitMicroTriangleVertexPositionsNV;
    break;
  case EbvMicroTriangleBaryNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingDisplacementMicromapNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_displacement_micromap");
    BVar2 = BuiltInHitMicroTriangleVertexBarycentricsNV;
    break;
  case EbvHitKindFrontFacingMicroTriangleNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingDisplacementMicromapNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_displacement_micromap");
    BVar2 = BuiltInHitKindFrontFacingMicroTriangleNV;
    break;
  case EbvHitKindBackFacingMicroTriangleNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingDisplacementMicromapNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_displacement_micromap");
    BVar2 = BuiltInHitKindBackFacingMicroTriangleNV;
    break;
  case EbvHitIsSphereNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingSpheresGeometryNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_linear_swept_spheres");
    BVar2 = BuiltInHitIsSphereNV;
    break;
  case EbvHitIsLSSNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingLinearSweptSpheresGeometryNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_linear_swept_spheres");
    BVar2 = BuiltInHitIsLSSNV;
    break;
  case EbvHitSpherePositionNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingSpheresGeometryNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_linear_swept_spheres");
    BVar2 = BuiltInHitSpherePositionNV;
    break;
  case EbvHitSphereRadiusNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingSpheresGeometryNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_linear_swept_spheres");
    BVar2 = BuiltInHitSphereRadiusNV;
    break;
  case EbvHitLSSPositionsNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingLinearSweptSpheresGeometryNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_linear_swept_spheres");
    BVar2 = BuiltInHitLSSPositionsNV;
    break;
  case EbvHitLSSRadiiNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingLinearSweptSpheresGeometryNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_linear_swept_spheres");
    BVar2 = BuiltInHitLSSRadiiNV;
    break;
  case EbvPrimitivePointIndicesEXT:
    BVar2 = BuiltInPrimitivePointIndicesEXT;
    break;
  case EbvPrimitiveLineIndicesEXT:
    BVar2 = BuiltInPrimitiveLineIndicesEXT;
    break;
  case EbvPrimitiveTriangleIndicesEXT:
    BVar2 = BuiltInPrimitiveTriangleIndicesEXT;
    break;
  case EbvCullPrimitiveEXT:
    BVar2 = BuiltInCullPrimitiveEXT;
    break;
  case EbvWarpsPerSM:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_sm_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityShaderSMBuiltinsNV);
    BVar2 = BuiltInWarpsPerSMNV;
    break;
  case EbvSMCount:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_sm_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityShaderSMBuiltinsNV);
    BVar2 = BuiltInSMCountNV;
    break;
  case EbvWarpID:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_sm_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityShaderSMBuiltinsNV);
    BVar2 = BuiltInWarpIDNV;
    break;
  case EbvSMID:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_sm_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityShaderSMBuiltinsNV);
    BVar2 = BuiltInSMIDNV;
    break;
  case EbvCoreCountARM:
    spv::Builder::addExtension(&this->builder,"SPV_ARM_core_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityCoreBuiltinsARM);
    BVar2 = BuiltInCoreCountARM;
    break;
  case EbvCoreIDARM:
    spv::Builder::addExtension(&this->builder,"SPV_ARM_core_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityCoreBuiltinsARM);
    BVar2 = BuiltInCoreIDARM;
    break;
  case EbvCoreMaxIDARM:
    spv::Builder::addExtension(&this->builder,"SPV_ARM_core_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityCoreBuiltinsARM);
    BVar2 = BuiltInCoreMaxIDARM;
    break;
  case EbvWarpIDARM:
    spv::Builder::addExtension(&this->builder,"SPV_ARM_core_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityCoreBuiltinsARM);
    BVar2 = BuiltInWarpIDARM;
    break;
  case EbvWarpMaxIDARM:
    spv::Builder::addExtension(&this->builder,"SPV_ARM_core_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityCoreBuiltinsARM);
    BVar2 = BuiltInWarpMaxIDARM;
    break;
  case EbvPositionFetch:
    BVar2 = BuiltInHitTriangleVertexPositionsKHR;
  }
  return BVar2;
}

Assistant:

spv::BuiltIn TGlslangToSpvTraverser::TranslateBuiltInDecoration(glslang::TBuiltInVariable builtIn,
    bool memberDeclaration)
{
    switch (builtIn) {
    case glslang::EbvPointSize:
        // Defer adding the capability until the built-in is actually used.
        if (! memberDeclaration) {
            switch (glslangIntermediate->getStage()) {
            case EShLangGeometry:
                builder.addCapability(spv::CapabilityGeometryPointSize);
                break;
            case EShLangTessControl:
            case EShLangTessEvaluation:
                builder.addCapability(spv::CapabilityTessellationPointSize);
                break;
            default:
                break;
            }
        }
        return spv::BuiltInPointSize;

    case glslang::EbvPosition:             return spv::BuiltInPosition;
    case glslang::EbvVertexId:             return spv::BuiltInVertexId;
    case glslang::EbvInstanceId:           return spv::BuiltInInstanceId;
    case glslang::EbvVertexIndex:          return spv::BuiltInVertexIndex;
    case glslang::EbvInstanceIndex:        return spv::BuiltInInstanceIndex;

    case glslang::EbvFragCoord:            return spv::BuiltInFragCoord;
    case glslang::EbvPointCoord:           return spv::BuiltInPointCoord;
    case glslang::EbvFace:                 return spv::BuiltInFrontFacing;
    case glslang::EbvFragDepth:            return spv::BuiltInFragDepth;

    case glslang::EbvNumWorkGroups:        return spv::BuiltInNumWorkgroups;
    case glslang::EbvWorkGroupSize:        return spv::BuiltInWorkgroupSize;
    case glslang::EbvWorkGroupId:          return spv::BuiltInWorkgroupId;
    case glslang::EbvLocalInvocationId:    return spv::BuiltInLocalInvocationId;
    case glslang::EbvLocalInvocationIndex: return spv::BuiltInLocalInvocationIndex;
    case glslang::EbvGlobalInvocationId:   return spv::BuiltInGlobalInvocationId;

    // These *Distance capabilities logically belong here, but if the member is declared and
    // then never used, consumers of SPIR-V prefer the capability not be declared.
    // They are now generated when used, rather than here when declared.
    // Potentially, the specification should be more clear what the minimum
    // use needed is to trigger the capability.
    //
    case glslang::EbvClipDistance:
        if (!memberDeclaration)
            builder.addCapability(spv::CapabilityClipDistance);
        return spv::BuiltInClipDistance;

    case glslang::EbvCullDistance:
        if (!memberDeclaration)
            builder.addCapability(spv::CapabilityCullDistance);
        return spv::BuiltInCullDistance;

    case glslang::EbvViewportIndex:
        if (glslangIntermediate->getStage() == EShLangGeometry ||
            glslangIntermediate->getStage() == EShLangFragment) {
            builder.addCapability(spv::CapabilityMultiViewport);
        }
        if (glslangIntermediate->getStage() == EShLangVertex ||
            glslangIntermediate->getStage() == EShLangTessControl ||
            glslangIntermediate->getStage() == EShLangTessEvaluation) {

            if (builder.getSpvVersion() < spv::Spv_1_5) {
                builder.addIncorporatedExtension(spv::E_SPV_EXT_shader_viewport_index_layer, spv::Spv_1_5);
                builder.addCapability(spv::CapabilityShaderViewportIndexLayerEXT);
            }
            else
                builder.addCapability(spv::CapabilityShaderViewportIndex);
        }
        return spv::BuiltInViewportIndex;

    case glslang::EbvSampleId:
        builder.addCapability(spv::CapabilitySampleRateShading);
        return spv::BuiltInSampleId;

    case glslang::EbvSamplePosition:
        builder.addCapability(spv::CapabilitySampleRateShading);
        return spv::BuiltInSamplePosition;

    case glslang::EbvSampleMask:
        return spv::BuiltInSampleMask;

    case glslang::EbvLayer:
        if (glslangIntermediate->getStage() == EShLangMesh) {
            return spv::BuiltInLayer;
        }
        if (glslangIntermediate->getStage() == EShLangGeometry ||
            glslangIntermediate->getStage() == EShLangFragment) {
            builder.addCapability(spv::CapabilityGeometry);
        }
        if (glslangIntermediate->getStage() == EShLangVertex ||
            glslangIntermediate->getStage() == EShLangTessControl ||
            glslangIntermediate->getStage() == EShLangTessEvaluation) {

            if (builder.getSpvVersion() < spv::Spv_1_5) {
                builder.addIncorporatedExtension(spv::E_SPV_EXT_shader_viewport_index_layer, spv::Spv_1_5);
                builder.addCapability(spv::CapabilityShaderViewportIndexLayerEXT);
            } else
                builder.addCapability(spv::CapabilityShaderLayer);
        }
        return spv::BuiltInLayer;

    case glslang::EbvBaseVertex:
        builder.addIncorporatedExtension(spv::E_SPV_KHR_shader_draw_parameters, spv::Spv_1_3);
        builder.addCapability(spv::CapabilityDrawParameters);
        return spv::BuiltInBaseVertex;

    case glslang::EbvBaseInstance:
        builder.addIncorporatedExtension(spv::E_SPV_KHR_shader_draw_parameters, spv::Spv_1_3);
        builder.addCapability(spv::CapabilityDrawParameters);
        return spv::BuiltInBaseInstance;

    case glslang::EbvDrawId:
        builder.addIncorporatedExtension(spv::E_SPV_KHR_shader_draw_parameters, spv::Spv_1_3);
        builder.addCapability(spv::CapabilityDrawParameters);
        return spv::BuiltInDrawIndex;

    case glslang::EbvPrimitiveId:
        if (glslangIntermediate->getStage() == EShLangFragment)
            builder.addCapability(spv::CapabilityGeometry);
        return spv::BuiltInPrimitiveId;

    case glslang::EbvFragStencilRef:
        builder.addExtension(spv::E_SPV_EXT_shader_stencil_export);
        builder.addCapability(spv::CapabilityStencilExportEXT);
        return spv::BuiltInFragStencilRefEXT;

    case glslang::EbvShadingRateKHR:
        builder.addExtension(spv::E_SPV_KHR_fragment_shading_rate);
        builder.addCapability(spv::CapabilityFragmentShadingRateKHR);
        return spv::BuiltInShadingRateKHR;

    case glslang::EbvPrimitiveShadingRateKHR:
        builder.addExtension(spv::E_SPV_KHR_fragment_shading_rate);
        builder.addCapability(spv::CapabilityFragmentShadingRateKHR);
        return spv::BuiltInPrimitiveShadingRateKHR;

    case glslang::EbvInvocationId:         return spv::BuiltInInvocationId;
    case glslang::EbvTessLevelInner:       return spv::BuiltInTessLevelInner;
    case glslang::EbvTessLevelOuter:       return spv::BuiltInTessLevelOuter;
    case glslang::EbvTessCoord:            return spv::BuiltInTessCoord;
    case glslang::EbvPatchVertices:        return spv::BuiltInPatchVertices;
    case glslang::EbvHelperInvocation:     return spv::BuiltInHelperInvocation;

    case glslang::EbvSubGroupSize:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupSize;

    case glslang::EbvSubGroupInvocation:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupLocalInvocationId;

    case glslang::EbvSubGroupEqMask:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupEqMask;

    case glslang::EbvSubGroupGeMask:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupGeMask;

    case glslang::EbvSubGroupGtMask:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupGtMask;

    case glslang::EbvSubGroupLeMask:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupLeMask;

    case glslang::EbvSubGroupLtMask:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupLtMask;

    case glslang::EbvNumSubgroups:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        return spv::BuiltInNumSubgroups;

    case glslang::EbvSubgroupID:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        return spv::BuiltInSubgroupId;

    case glslang::EbvSubgroupSize2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        return spv::BuiltInSubgroupSize;

    case glslang::EbvSubgroupInvocation2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        return spv::BuiltInSubgroupLocalInvocationId;

    case glslang::EbvSubgroupEqMask2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        return spv::BuiltInSubgroupEqMask;

    case glslang::EbvSubgroupGeMask2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        return spv::BuiltInSubgroupGeMask;

    case glslang::EbvSubgroupGtMask2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        return spv::BuiltInSubgroupGtMask;

    case glslang::EbvSubgroupLeMask2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        return spv::BuiltInSubgroupLeMask;

    case glslang::EbvSubgroupLtMask2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        return spv::BuiltInSubgroupLtMask;

    case glslang::EbvBaryCoordNoPersp:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordNoPerspAMD;

    case glslang::EbvBaryCoordNoPerspCentroid:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordNoPerspCentroidAMD;

    case glslang::EbvBaryCoordNoPerspSample:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordNoPerspSampleAMD;

    case glslang::EbvBaryCoordSmooth:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordSmoothAMD;

    case glslang::EbvBaryCoordSmoothCentroid:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordSmoothCentroidAMD;

    case glslang::EbvBaryCoordSmoothSample:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordSmoothSampleAMD;

    case glslang::EbvBaryCoordPullModel:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordPullModelAMD;

    case glslang::EbvDeviceIndex:
        builder.addIncorporatedExtension(spv::E_SPV_KHR_device_group, spv::Spv_1_3);
        builder.addCapability(spv::CapabilityDeviceGroup);
        return spv::BuiltInDeviceIndex;

    case glslang::EbvViewIndex:
        builder.addIncorporatedExtension(spv::E_SPV_KHR_multiview, spv::Spv_1_3);
        builder.addCapability(spv::CapabilityMultiView);
        return spv::BuiltInViewIndex;

    case glslang::EbvFragSizeEXT:
        builder.addExtension(spv::E_SPV_EXT_fragment_invocation_density);
        builder.addCapability(spv::CapabilityFragmentDensityEXT);
        return spv::BuiltInFragSizeEXT;

    case glslang::EbvFragInvocationCountEXT:
        builder.addExtension(spv::E_SPV_EXT_fragment_invocation_density);
        builder.addCapability(spv::CapabilityFragmentDensityEXT);
        return spv::BuiltInFragInvocationCountEXT;

    case glslang::EbvViewportMaskNV:
        if (!memberDeclaration) {
            builder.addExtension(spv::E_SPV_NV_viewport_array2);
            builder.addCapability(spv::CapabilityShaderViewportMaskNV);
        }
        return spv::BuiltInViewportMaskNV;
    case glslang::EbvSecondaryPositionNV:
        if (!memberDeclaration) {
            builder.addExtension(spv::E_SPV_NV_stereo_view_rendering);
            builder.addCapability(spv::CapabilityShaderStereoViewNV);
        }
        return spv::BuiltInSecondaryPositionNV;
    case glslang::EbvSecondaryViewportMaskNV:
        if (!memberDeclaration) {
            builder.addExtension(spv::E_SPV_NV_stereo_view_rendering);
            builder.addCapability(spv::CapabilityShaderStereoViewNV);
        }
        return spv::BuiltInSecondaryViewportMaskNV;
    case glslang::EbvPositionPerViewNV:
        if (!memberDeclaration) {
            builder.addExtension(spv::E_SPV_NVX_multiview_per_view_attributes);
            builder.addCapability(spv::CapabilityPerViewAttributesNV);
        }
        return spv::BuiltInPositionPerViewNV;
    case glslang::EbvViewportMaskPerViewNV:
        if (!memberDeclaration) {
            builder.addExtension(spv::E_SPV_NVX_multiview_per_view_attributes);
            builder.addCapability(spv::CapabilityPerViewAttributesNV);
        }
        return spv::BuiltInViewportMaskPerViewNV;
    case glslang::EbvFragFullyCoveredNV:
        builder.addExtension(spv::E_SPV_EXT_fragment_fully_covered);
        builder.addCapability(spv::CapabilityFragmentFullyCoveredEXT);
        return spv::BuiltInFullyCoveredEXT;
    case glslang::EbvFragmentSizeNV:
        builder.addExtension(spv::E_SPV_NV_shading_rate);
        builder.addCapability(spv::CapabilityShadingRateNV);
        return spv::BuiltInFragmentSizeNV;
    case glslang::EbvInvocationsPerPixelNV:
        builder.addExtension(spv::E_SPV_NV_shading_rate);
        builder.addCapability(spv::CapabilityShadingRateNV);
        return spv::BuiltInInvocationsPerPixelNV;

    // ray tracing
    case glslang::EbvLaunchId:
        return spv::BuiltInLaunchIdKHR;
    case glslang::EbvLaunchSize:
        return spv::BuiltInLaunchSizeKHR;
    case glslang::EbvWorldRayOrigin:
        return spv::BuiltInWorldRayOriginKHR;
    case glslang::EbvWorldRayDirection:
        return spv::BuiltInWorldRayDirectionKHR;
    case glslang::EbvObjectRayOrigin:
        return spv::BuiltInObjectRayOriginKHR;
    case glslang::EbvObjectRayDirection:
        return spv::BuiltInObjectRayDirectionKHR;
    case glslang::EbvRayTmin:
        return spv::BuiltInRayTminKHR;
    case glslang::EbvRayTmax:
        return spv::BuiltInRayTmaxKHR;
    case glslang::EbvCullMask:
        return spv::BuiltInCullMaskKHR;
    case glslang::EbvPositionFetch:
        return spv::BuiltInHitTriangleVertexPositionsKHR;
    case glslang::EbvInstanceCustomIndex:
        return spv::BuiltInInstanceCustomIndexKHR;
    case glslang::EbvHitKind:
        return spv::BuiltInHitKindKHR;
    case glslang::EbvObjectToWorld:
    case glslang::EbvObjectToWorld3x4:
        return spv::BuiltInObjectToWorldKHR;
    case glslang::EbvWorldToObject:
    case glslang::EbvWorldToObject3x4:
        return spv::BuiltInWorldToObjectKHR;
    case glslang::EbvIncomingRayFlags:
        return spv::BuiltInIncomingRayFlagsKHR;
    case glslang::EbvGeometryIndex:
        return spv::BuiltInRayGeometryIndexKHR;
    case glslang::EbvCurrentRayTimeNV:
        builder.addExtension(spv::E_SPV_NV_ray_tracing_motion_blur);
        builder.addCapability(spv::CapabilityRayTracingMotionBlurNV);
        return spv::BuiltInCurrentRayTimeNV;
    case glslang::EbvMicroTrianglePositionNV:
        builder.addCapability(spv::CapabilityRayTracingDisplacementMicromapNV);
        builder.addExtension("SPV_NV_displacement_micromap");
        return spv::BuiltInHitMicroTriangleVertexPositionsNV;
    case glslang::EbvMicroTriangleBaryNV:
        builder.addCapability(spv::CapabilityRayTracingDisplacementMicromapNV);
        builder.addExtension("SPV_NV_displacement_micromap");
        return spv::BuiltInHitMicroTriangleVertexBarycentricsNV;
    case glslang::EbvHitKindFrontFacingMicroTriangleNV:
        builder.addCapability(spv::CapabilityRayTracingDisplacementMicromapNV);
        builder.addExtension("SPV_NV_displacement_micromap");
        return spv::BuiltInHitKindFrontFacingMicroTriangleNV;
    case glslang::EbvHitKindBackFacingMicroTriangleNV:
        builder.addCapability(spv::CapabilityRayTracingDisplacementMicromapNV);
        builder.addExtension("SPV_NV_displacement_micromap");
        return spv::BuiltInHitKindBackFacingMicroTriangleNV;
    case glslang::EbvClusterIDNV:
        builder.addCapability(spv::CapabilityRayTracingClusterAccelerationStructureNV);
        builder.addExtension("SPV_NV_cluster_acceleration_structure");
        return spv::BuiltInClusterIDNV;
    case glslang::EbvHitIsSphereNV:
        builder.addCapability(spv::CapabilityRayTracingSpheresGeometryNV);
        builder.addExtension("SPV_NV_linear_swept_spheres");
        return spv::BuiltInHitIsSphereNV;
    case glslang::EbvHitIsLSSNV:
        builder.addCapability(spv::CapabilityRayTracingLinearSweptSpheresGeometryNV);
        builder.addExtension("SPV_NV_linear_swept_spheres");
        return spv::BuiltInHitIsLSSNV;
    case glslang::EbvHitSpherePositionNV:
        builder.addCapability(spv::CapabilityRayTracingSpheresGeometryNV);
        builder.addExtension("SPV_NV_linear_swept_spheres");
        return spv::BuiltInHitSpherePositionNV;
    case glslang::EbvHitSphereRadiusNV:
        builder.addCapability(spv::CapabilityRayTracingSpheresGeometryNV);
        builder.addExtension("SPV_NV_linear_swept_spheres");
        return spv::BuiltInHitSphereRadiusNV;
    case glslang::EbvHitLSSPositionsNV:
        builder.addCapability(spv::CapabilityRayTracingLinearSweptSpheresGeometryNV);
        builder.addExtension("SPV_NV_linear_swept_spheres");
        return spv::BuiltInHitLSSPositionsNV;
    case glslang::EbvHitLSSRadiiNV:
        builder.addCapability(spv::CapabilityRayTracingLinearSweptSpheresGeometryNV);
        builder.addExtension("SPV_NV_linear_swept_spheres");
        return spv::BuiltInHitLSSRadiiNV;

    // barycentrics
    case glslang::EbvBaryCoordNV:
        builder.addExtension(spv::E_SPV_NV_fragment_shader_barycentric);
        builder.addCapability(spv::CapabilityFragmentBarycentricNV);
        return spv::BuiltInBaryCoordNV;
    case glslang::EbvBaryCoordNoPerspNV:
        builder.addExtension(spv::E_SPV_NV_fragment_shader_barycentric);
        builder.addCapability(spv::CapabilityFragmentBarycentricNV);
        return spv::BuiltInBaryCoordNoPerspNV;

    case glslang::EbvBaryCoordEXT:
        builder.addExtension(spv::E_SPV_KHR_fragment_shader_barycentric);
        builder.addCapability(spv::CapabilityFragmentBarycentricKHR);
        return spv::BuiltInBaryCoordKHR;
    case glslang::EbvBaryCoordNoPerspEXT:
        builder.addExtension(spv::E_SPV_KHR_fragment_shader_barycentric);
        builder.addCapability(spv::CapabilityFragmentBarycentricKHR);
        return spv::BuiltInBaryCoordNoPerspKHR;

    // mesh shaders
    case glslang::EbvTaskCountNV:
        return spv::BuiltInTaskCountNV;
    case glslang::EbvPrimitiveCountNV:
        return spv::BuiltInPrimitiveCountNV;
    case glslang::EbvPrimitiveIndicesNV:
        return spv::BuiltInPrimitiveIndicesNV;
    case glslang::EbvClipDistancePerViewNV:
        return spv::BuiltInClipDistancePerViewNV;
    case glslang::EbvCullDistancePerViewNV:
        return spv::BuiltInCullDistancePerViewNV;
    case glslang::EbvLayerPerViewNV:
        return spv::BuiltInLayerPerViewNV;
    case glslang::EbvMeshViewCountNV:
        return spv::BuiltInMeshViewCountNV;
    case glslang::EbvMeshViewIndicesNV:
        return spv::BuiltInMeshViewIndicesNV;

    // SPV_EXT_mesh_shader
    case glslang::EbvPrimitivePointIndicesEXT:
        return spv::BuiltInPrimitivePointIndicesEXT;
    case glslang::EbvPrimitiveLineIndicesEXT:
        return spv::BuiltInPrimitiveLineIndicesEXT;
    case glslang::EbvPrimitiveTriangleIndicesEXT:
        return spv::BuiltInPrimitiveTriangleIndicesEXT;
    case glslang::EbvCullPrimitiveEXT:
        return spv::BuiltInCullPrimitiveEXT;

    // sm builtins
    case glslang::EbvWarpsPerSM:
        builder.addExtension(spv::E_SPV_NV_shader_sm_builtins);
        builder.addCapability(spv::CapabilityShaderSMBuiltinsNV);
        return spv::BuiltInWarpsPerSMNV;
    case glslang::EbvSMCount:
        builder.addExtension(spv::E_SPV_NV_shader_sm_builtins);
        builder.addCapability(spv::CapabilityShaderSMBuiltinsNV);
        return spv::BuiltInSMCountNV;
    case glslang::EbvWarpID:
        builder.addExtension(spv::E_SPV_NV_shader_sm_builtins);
        builder.addCapability(spv::CapabilityShaderSMBuiltinsNV);
        return spv::BuiltInWarpIDNV;
    case glslang::EbvSMID:
        builder.addExtension(spv::E_SPV_NV_shader_sm_builtins);
        builder.addCapability(spv::CapabilityShaderSMBuiltinsNV);
        return spv::BuiltInSMIDNV;

   // ARM builtins
    case glslang::EbvCoreCountARM:
        builder.addExtension(spv::E_SPV_ARM_core_builtins);
        builder.addCapability(spv::CapabilityCoreBuiltinsARM);
        return spv::BuiltInCoreCountARM;
    case glslang::EbvCoreIDARM:
        builder.addExtension(spv::E_SPV_ARM_core_builtins);
        builder.addCapability(spv::CapabilityCoreBuiltinsARM);
        return spv::BuiltInCoreIDARM;
    case glslang::EbvCoreMaxIDARM:
        builder.addExtension(spv::E_SPV_ARM_core_builtins);
        builder.addCapability(spv::CapabilityCoreBuiltinsARM);
        return spv::BuiltInCoreMaxIDARM;
    case glslang::EbvWarpIDARM:
        builder.addExtension(spv::E_SPV_ARM_core_builtins);
        builder.addCapability(spv::CapabilityCoreBuiltinsARM);
        return spv::BuiltInWarpIDARM;
    case glslang::EbvWarpMaxIDARM:
        builder.addExtension(spv::E_SPV_ARM_core_builtins);
        builder.addCapability(spv::CapabilityCoreBuiltinsARM);
        return spv::BuiltInWarpMaxIDARM;

    default:
        return spv::BuiltInMax;
    }
}